

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_decoder_init_memory
                    (void *pData,size_t dataSize,ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  _func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *p_Var1;
  ma_result mVar2;
  ma_decoder_config *pConfig_00;
  ma_decoder *pDecoder_00;
  ulong uVar3;
  ma_decoder_config config;
  ma_decoder_config config_1;
  
  if (pConfig == (ma_decoder_config *)0x0) {
    memset(&config_1,0,0x90);
  }
  else {
    memcpy(&config_1,pConfig,0x90);
  }
  memcpy(&config,&config_1,0x90);
  mVar2 = ma_decoder__preinit((ma_decoder_read_proc)0x0,(ma_decoder_seek_proc)0x0,
                              (ma_decoder_tell_proc)0x0,(void *)0x0,&config,pDecoder);
  if (mVar2 != MA_SUCCESS) {
    return mVar2;
  }
  if (dataSize == 0 || pData == (void *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (config.encodingFormat != ma_encoding_format_unknown) {
    mVar2 = MA_NO_BACKEND;
    if (config.encodingFormat == ma_encoding_format_wav) {
      mVar2 = ma_decoder_init_wav_from_memory__internal(pData,dataSize,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_flac) {
      mVar2 = ma_decoder_init_flac_from_memory__internal(pData,dataSize,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_mp3) {
      mVar2 = ma_decoder_init_mp3_from_memory__internal(pData,dataSize,&config,pDecoder);
    }
    if (config.encodingFormat == ma_encoding_format_vorbis) {
      mVar2 = ma_decoder_init_vorbis_from_memory__internal(pData,dataSize,&config,pDecoder);
    }
    if (mVar2 == MA_SUCCESS) goto LAB_0016961a;
  }
  if (config.ppCustomBackendVTables != (ma_decoding_backend_vtable **)0x0) {
    for (uVar3 = 0; uVar3 < config.customBackendCount; uVar3 = uVar3 + 1) {
      if ((config.ppCustomBackendVTables[uVar3] != (ma_decoding_backend_vtable *)0x0) &&
         (mVar2 = ma_decoder_init_from_memory__internal
                            (config.ppCustomBackendVTables[uVar3],config.pCustomBackendUserData,
                             pData,dataSize,&config,pDecoder), mVar2 == MA_SUCCESS))
      goto LAB_0016961a;
    }
  }
  if (config.encodingFormat != ma_encoding_format_unknown) {
    return MA_NO_BACKEND;
  }
  mVar2 = ma_decoder_init_wav_from_memory__internal(pData,dataSize,&config,pDecoder);
  if ((((mVar2 != MA_SUCCESS) &&
       (mVar2 = ma_decoder_init_flac_from_memory__internal(pData,dataSize,&config,pDecoder),
       mVar2 != MA_SUCCESS)) &&
      (mVar2 = ma_decoder_init_mp3_from_memory__internal(pData,dataSize,&config,pDecoder),
      mVar2 != MA_SUCCESS)) &&
     (mVar2 = ma_decoder_init_vorbis_from_memory__internal(pData,dataSize,&config,pDecoder),
     mVar2 != MA_SUCCESS)) {
    pDecoder_00 = (ma_decoder *)&config;
    pConfig_00 = (ma_decoder_config *)0x0;
    mVar2 = ma_decoder__preinit(ma_decoder__on_read_memory,ma_decoder__on_seek_memory,
                                ma_decoder__on_tell_memory,(void *)0x0,
                                (ma_decoder_config *)pDecoder_00,pDecoder);
    if (mVar2 != MA_SUCCESS) {
      return mVar2;
    }
    (pDecoder->data).vfs.pVFS = pData;
    (pDecoder->data).memory.dataSize = dataSize;
    (pDecoder->data).memory.currentReadPos = 0;
    mVar2 = ma_decoder_init__internal
                      (ma_decoder__on_seek_memory,(ma_decoder_seek_proc)&config,pDecoder,pConfig_00,
                       pDecoder_00);
    if (mVar2 == MA_SUCCESS) {
      return MA_SUCCESS;
    }
    return mVar2;
  }
LAB_0016961a:
  mVar2 = ma_decoder__postinit(&config,pDecoder);
  if (mVar2 == MA_SUCCESS) {
    return MA_SUCCESS;
  }
  if (pDecoder->pBackendVTable != (ma_decoding_backend_vtable *)0x0) {
    p_Var1 = pDecoder->pBackendVTable->onUninit;
    if (p_Var1 != (_func_void_void_ptr_ma_data_source_ptr_ma_allocation_callbacks_ptr *)0x0) {
      (*p_Var1)(pDecoder->pBackendUserData,&pDecoder->pBackend,&pDecoder->allocationCallbacks);
      return mVar2;
    }
    return mVar2;
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_decoder_init_memory(const void* pData, size_t dataSize, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result;
    ma_decoder_config config;

    config = ma_decoder_config_init_copy(pConfig);

    result = ma_decoder__preinit(NULL, NULL, NULL, NULL, &config, pDecoder);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pData == NULL || dataSize == 0) {
        return MA_INVALID_ARGS;
    }

    /* If the backend has support for loading from a file path we'll want to use that. If that all fails we'll fall back to the VFS path. */
    result = MA_NO_BACKEND;

    if (config.encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (config.encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (config.encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (config.encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (config.encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we weren't able to initialize a decoder of a specific encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        result = ma_decoder_init_custom_from_memory__internal(pData, dataSize, &config, pDecoder);

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (result != MA_SUCCESS && config.encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

        /* Use trial and error for stock decoders. */
        if (result != MA_SUCCESS) {
        #ifdef MA_HAS_WAV
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_wav_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_FLAC
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_flac_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_MP3
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_mp3_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        #ifdef MA_HAS_VORBIS
            if (result != MA_SUCCESS) {
                result = ma_decoder_init_vorbis_from_memory__internal(pData, dataSize, &config, pDecoder);
            }
        #endif
        }
    }

    /*
    If at this point we still haven't successfully initialized the decoder it most likely means
    the backend doesn't have an implementation for loading from a file path. We'll try using
    miniaudio's built-in file IO for loading file.
    */
    if (result == MA_SUCCESS) {
        /* Initialization was successful. Finish up. */
        result = ma_decoder__postinit(&config, pDecoder);
        if (result != MA_SUCCESS) {
            /*
            The backend was initialized successfully, but for some reason post-initialization failed. This is most likely
            due to an out of memory error. We're going to abort with an error here and not try to recover.
            */
            if (pDecoder->pBackendVTable != NULL && pDecoder->pBackendVTable->onUninit != NULL) {
                pDecoder->pBackendVTable->onUninit(pDecoder->pBackendUserData, &pDecoder->pBackend, &pDecoder->allocationCallbacks);
            }

            return result;
        }
    } else {
        /* Probably no implementation for loading from a block of memory. Use miniaudio's abstraction instead. */
        result = ma_decoder__preinit_memory_wrapper(pData, dataSize, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }

        result = ma_decoder_init__internal(ma_decoder__on_read_memory, ma_decoder__on_seek_memory, NULL, &config, pDecoder);
        if (result != MA_SUCCESS) {
            return result;
        }
    }

    return MA_SUCCESS;
}